

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void __thiscall
LiteScript::_Type_ARRAY::Load
          (_Type_ARRAY *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  long *plVar1;
  Memory *pMVar2;
  undefined8 idx;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  code *pcVar8;
  long in_R8;
  string key;
  Nullable<LiteScript::Variable> local_88;
  Array *local_68;
  Object *local_60;
  long local_58;
  Nullable<LiteScript::Variable> local_50;
  
  local_58 = in_R8;
  Object::Reassign(object,(Type *)_type_array,0x38);
  Array::Array((Array *)object->data,object->memory);
  local_68 = (Array *)object->data;
  local_60 = object;
  uVar4 = std::istream::get();
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  iVar7 = std::istream::get();
  uVar4 = iVar7 << 0x18 | (uVar6 & 0xff) << 0x10 | (uVar5 & 0xff) << 8 | uVar4 & 0xff;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pMVar2 = local_60->memory;
      plVar1 = (long *)((long)(pMVar2->arr)._M_elems + local_58);
      pcVar8 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar8 = *(code **)(*plVar1 + -1 + caller);
      }
      uVar6 = (*pcVar8)(plVar1,stream);
      Memory::GetVariable(&local_88,pMVar2,uVar6);
      Array::Add(local_68,uVar5,(Variable *)&local_88);
      if (local_88.is_null == false) {
        Variable::~Variable((Variable *)&local_88);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  uVar4 = std::istream::get();
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  iVar7 = std::istream::get();
  uVar4 = iVar7 << 0x18 | (uVar6 & 0xff) << 0x10 | (uVar5 & 0xff) << 8 | uVar4 & 0xff;
  local_88.data._0_8_ = (long)&local_88 + 0x10;
  local_88.data[8] = '\0';
  local_88.data[9] = '\0';
  local_88.data[10] = '\0';
  local_88.data[0xb] = '\0';
  local_88.data[0xc] = '\0';
  local_88.data[0xd] = '\0';
  local_88.data[0xe] = '\0';
  local_88.data[0xf] = '\0';
  local_88.is_null = false;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      local_88.data[8] = '\0';
      local_88.data[9] = '\0';
      local_88.data[10] = '\0';
      local_88.data[0xb] = '\0';
      local_88.data[0xc] = '\0';
      local_88.data[0xd] = '\0';
      local_88.data[0xe] = '\0';
      local_88.data[0xf] = '\0';
      *(char *)local_88.data._0_8_ = '\0';
      while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
        cVar3 = std::istream::get();
        if (cVar3 == '\0') break;
        std::__cxx11::string::push_back((char)&local_88);
      }
      idx = local_88.data._0_8_;
      pMVar2 = local_60->memory;
      plVar1 = (long *)((long)(pMVar2->arr)._M_elems + local_58);
      pcVar8 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar8 = *(code **)(*plVar1 + -1 + caller);
      }
      uVar6 = (*pcVar8)(plVar1,stream);
      Memory::GetVariable(&local_50,pMVar2,uVar6);
      Array::Add(local_68,(char *)idx,(Variable *)&local_50);
      if (local_50.is_null == false) {
        Variable::~Variable((Variable *)&local_50);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  if ((char *)local_88.data._0_8_ != (char *)((long)&local_88 + 0x10U)) {
    operator_delete((void *)local_88.data._0_8_);
  }
  return;
}

Assistant:

void LiteScript::_Type_ARRAY::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::ARRAY, sizeof(Array));
    std::allocator<Array> allocator;
    allocator.construct(&object.GetData<Array>(), object.memory);
    Array& obj = object.GetData<Array>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        obj.Add(i, *object.memory.GetVariable((object.memory.*caller)(stream)));
    sz = IStreamer::Read<unsigned int>(stream);
    std::string key;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
            key += c;
        obj.Add(key.c_str(), *object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}